

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O2

bool __thiscall
axl::zip::ZipReader::extractFileToMem(ZipReader *this,size_t index,void *p,size_t size)

{
  mz_bool mVar1;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_430;
  char readBuffer [1024];
  
  mVar1 = mz_zip_reader_extract_to_mem_no_alloc
                    (this->m_zip,(mz_uint)index,p,size,0,readBuffer,0x400);
  if (mVar1 == 0) {
    err::ErrorRef::ErrorRef((ErrorRef *)&local_430,5);
    err::setError((ErrorRef *)&local_430);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&local_430);
  }
  return mVar1 != 0;
}

Assistant:

bool
ZipReader::extractFileToMem(
	size_t index,
	void* p,
	size_t size
) const {
	ASSERT(isOpen());

	char readBuffer[1024];
	mz_bool result = mz_zip_reader_extract_to_mem_no_alloc(
		m_zip,
		index,
		p,
		size,
		0,
		readBuffer,
		sizeof(readBuffer)
	);

	return result ? true : err::fail(err::SystemErrorCode_Unsuccessful);
}